

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_client_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  byte *pbVar1;
  ptls_key_exchange_context_t **pppVar2;
  char cVar3;
  uint16_t uVar4;
  st_ptls_get_time_t *psVar5;
  ptls_key_schedule_t *ppVar6;
  st_ptls_decompress_certificate_t *psVar7;
  ptls_cipher_suite_t *ppVar8;
  ptls_key_exchange_context_t *ppVar9;
  st_ptls_aead_context_t *__ptr;
  ptls_key_exchange_algorithm_t *ppVar10;
  st_ptls_on_extension_t *psVar11;
  st_ptls_update_traffic_key_t *psVar12;
  ptls_buffer_t *buf;
  size_t sVar13;
  st_ptls_save_ticket_t *psVar14;
  ptls_iovec_t pVar15;
  ptls_iovec_t nonce;
  undefined1 auVar16 [16];
  bool bVar17;
  undefined1 auVar18 [16];
  undefined6 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  byte bVar23;
  ushort uVar24;
  int iVar25;
  int iVar26;
  uint64_t uVar27;
  uint8_t *src;
  uint uVar28;
  uint uVar29;
  ptls_key_exchange_algorithm_t **pppVar30;
  long lVar31;
  uint uVar32;
  ptls_message_emitter_t *emitter_00;
  uint8_t *puVar33;
  uint8_t *puVar34;
  size_t sVar35;
  void *pvVar36;
  ushort *puVar37;
  ptls_cipher_suite_t **pppVar38;
  ushort uVar39;
  ushort uVar40;
  size_t sVar41;
  ushort *puVar42;
  ushort *puVar43;
  uint8_t *puVar44;
  ushort *puVar45;
  ulong uVar46;
  ptls_hash_context_t **pppVar47;
  long lVar48;
  bool bVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ptls_iovec_t pVar53;
  ptls_iovec_t pVar54;
  ptls_iovec_t context;
  ptls_iovec_t pVar55;
  ptls_iovec_t pVar56;
  ptls_iovec_t pVar57;
  ptls_iovec_t message_00;
  ptls_iovec_t pVar58;
  ptls_buffer_t ticket_buf;
  ptls_iovec_t ticket_nonce;
  uint32_t ticket_age_add;
  uint32_t max_early_data_size;
  st_ptls_server_hello_t sh;
  ushort local_292;
  undefined1 local_288 [24];
  int iStack_270;
  undefined4 uStack_26c;
  undefined8 local_268;
  ptls_iovec_t local_260;
  ushort *local_250;
  uint32_t local_248 [3];
  uint32_t local_23c;
  undefined1 local_238 [24];
  undefined8 uStack_220;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  undefined1 auStack_200 [8];
  ptls_iovec_t local_1f8 [28];
  
  uStack_26c = SUB84(local_288._16_8_,4);
  puVar33 = (uint8_t *)message.len;
  emitter_00 = (ptls_message_emitter_t *)message.base;
  uVar28 = tls->state - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
  if (0xd < uVar28) {
switchD_0011342c_caseD_8:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                  ,0x1160,
                  "int handle_client_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  }
  cVar3 = *(char *)&emitter_00->buf;
  message_00.len =
       (long)&switchD_0011342c::switchdataD_001287c0 +
       (long)(int)(&switchD_0011342c::switchdataD_001287c0)[uVar28];
  switch(tls->state) {
  case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
  case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
    if (is_end_of_record == 0 || cVar3 != '\x02') {
      return 10;
    }
    local_288._0_8_ = (uint8_t *)0x0;
    local_288._8_8_ = 0;
    local_260.base = (uint8_t *)((long)&emitter_00->buf + 4);
    local_238._0_8_ = (uint8_t *)0x0;
    local_238._8_8_ = 0;
    stack0xfffffffffffffdd8 = (undefined1  [16])0x0;
    local_218 = (undefined1  [16])0x0;
    _local_208 = (undefined1  [16])0x0;
    local_1f8[0].base = (uint8_t *)0x0;
    local_1f8[0].len = 0;
    uVar28 = 0x32;
    if ((5 < (long)puVar33) &&
       (local_260.base = (uint8_t *)((long)&emitter_00->buf + 6), 0x25 < (long)puVar33)) {
      auVar52[0] = -(*(char *)((long)&emitter_00->record_header_length + 6) == -0x3e);
      auVar52[1] = -(*(char *)((long)&emitter_00->record_header_length + 7) == -0x5e);
      auVar52[2] = -(*(char *)&emitter_00->begin_message == '\x11');
      auVar52[3] = -(*(char *)((long)&emitter_00->begin_message + 1) == '\x16');
      auVar52[4] = -(*(char *)((long)&emitter_00->begin_message + 2) == 'z');
      auVar52[5] = -(*(char *)((long)&emitter_00->begin_message + 3) == -0x45);
      auVar52[6] = -(*(char *)((long)&emitter_00->begin_message + 4) == -0x74);
      auVar52[7] = -(*(char *)((long)&emitter_00->begin_message + 5) == '^');
      auVar52[8] = -(*(char *)((long)&emitter_00->begin_message + 6) == '\a');
      auVar52[9] = -(*(char *)((long)&emitter_00->begin_message + 7) == -0x62);
      auVar52[10] = -(*(char *)&emitter_00->commit_message == '\t');
      auVar52[0xb] = -(*(char *)((long)&emitter_00->commit_message + 1) == -0x1e);
      auVar52[0xc] = -(*(char *)((long)&emitter_00->commit_message + 2) == -0x38);
      auVar52[0xd] = -(*(char *)((long)&emitter_00->commit_message + 3) == -0x58);
      auVar52[0xe] = -(*(char *)((long)&emitter_00->commit_message + 4) == '3');
      auVar52[0xf] = -(*(char *)((long)&emitter_00->commit_message + 5) == -100);
      auVar51[0] = -(*(char *)((long)&emitter_00->buf + 6) == -0x31);
      auVar51[1] = -(*(char *)((long)&emitter_00->buf + 7) == '!');
      auVar51[2] = -(*(char *)&emitter_00->enc == -0x53);
      auVar51[3] = -(*(char *)((long)&emitter_00->enc + 1) == 't');
      auVar51[4] = -(*(char *)((long)&emitter_00->enc + 2) == -0x1b);
      auVar51[5] = -(*(char *)((long)&emitter_00->enc + 3) == -0x66);
      auVar51[6] = -(*(char *)((long)&emitter_00->enc + 4) == 'a');
      auVar51[7] = -(*(char *)((long)&emitter_00->enc + 5) == '\x11');
      auVar51[8] = -(*(char *)((long)&emitter_00->enc + 6) == -0x42);
      auVar51[9] = -(*(char *)((long)&emitter_00->enc + 7) == '\x1d');
      auVar51[10] = -((char)emitter_00->record_header_length == -0x74);
      auVar51[0xb] = -(*(char *)((long)&emitter_00->record_header_length + 1) == '\x02');
      auVar51[0xc] = -(*(char *)((long)&emitter_00->record_header_length + 2) == '\x1e');
      auVar51[0xd] = -(*(char *)((long)&emitter_00->record_header_length + 3) == 'e');
      auVar51[0xe] = -(*(char *)((long)&emitter_00->record_header_length + 4) == -0x48);
      auVar51[0xf] = -(*(char *)((long)&emitter_00->record_header_length + 5) == -0x6f);
      auVar51 = auVar51 & auVar52;
      local_208[0] = (ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar51[0xf] >> 7) << 0xf) == 0xffff;
      local_208._1_3_ = 0;
      stack0xfffffffffffffdfc = SUB1612((undefined1  [16])0x0,4);
      local_260.base = (uint8_t *)((long)&emitter_00->commit_message + 6);
      if (puVar33 != (uint8_t *)0x26) {
        local_260.base = (uint8_t *)((long)&emitter_00->commit_message + 7);
        bVar23 = *(byte *)((long)&emitter_00->commit_message + 6);
        puVar44 = (uint8_t *)(ulong)bVar23;
        if (puVar44 <= puVar33 + -0x27 && puVar44 < (uint8_t *)0x21) {
          puVar37 = (ushort *)((long)&emitter_00->buf + (long)puVar33);
          puVar43 = (ushort *)((long)local_260.base + (long)puVar44);
          local_218[8] = bVar23;
          local_218._0_8_ = local_260.base;
          local_218._9_7_ = 0;
          if ((long)puVar37 - (long)puVar43 < 2) {
            uVar29 = 0x32;
            bVar50 = false;
            local_260.base = (uint8_t *)puVar43;
          }
          else {
            local_260.base = (uint8_t *)(puVar43 + 1);
            pppVar38 = tls->ctx->cipher_suites;
            ppVar8 = *pppVar38;
            while ((ppVar8 != (ptls_cipher_suite_t *)0x0 &&
                   (pppVar38 = pppVar38 + 1, ppVar8->id != (uint16_t)(*puVar43 << 8 | *puVar43 >> 8)
                   ))) {
              ppVar8 = *pppVar38;
            }
            tls->cipher_suite = ppVar8;
            bVar50 = ppVar8 != (ptls_cipher_suite_t *)0x0;
            uVar29 = 0x2f;
            if (bVar50) {
              uVar29 = 0;
            }
          }
          uVar28 = uVar29;
          if (bVar50) {
            puVar43 = (ushort *)local_260.base;
            if (((ushort *)local_260.base == puVar37) ||
               (puVar43 = (ushort *)((long)local_260.base + 1), *local_260.base != '\0')) {
LAB_00113fb4:
              local_260.base = (uint8_t *)puVar43;
              uVar28 = 0x2f;
            }
            else {
              if ((bool)local_208[0]) {
                auStack_200._0_2_ = 0xffff;
                auStack_200._2_6_ = 0;
              }
              local_248[0] = 0x12421;
              local_248[1] = 0x2400;
              uVar28 = 0x32;
              uVar24 = 0xffff;
              if ((ulong)((long)puVar37 - (long)puVar43) < 2) {
                bVar50 = false;
                local_292 = 0xffff;
                local_260.base = (uint8_t *)puVar43;
              }
              else {
                lVar31 = 0;
                uVar46 = 0;
                do {
                  uVar46 = (ulong)*(byte *)((long)puVar43 + lVar31) | uVar46 << 8;
                  lVar31 = lVar31 + 1;
                } while (lVar31 != 2);
                local_260.base = (uint8_t *)((long)local_260.base + 3);
                if ((ulong)((long)puVar37 - (long)local_260.base) < uVar46) {
                  bVar50 = false;
                  local_292 = 0xffff;
                }
                else {
                  if (uVar46 == 0) {
                    local_292 = 0xffff;
                    uVar28 = uVar29;
                  }
                  else {
                    puVar43 = (ushort *)(uVar46 + (long)local_260.base);
                    local_292 = 0xffff;
                    uVar24 = 0xffff;
                    do {
                      puVar44 = local_260.base;
                      uVar28 = 0x32;
                      if ((long)puVar43 - (long)local_260.base < 2) {
LAB_0011512a:
                        bVar50 = false;
                        goto LAB_00115136;
                      }
                      uVar39 = *(ushort *)local_260.base;
                      uVar40 = uVar39 << 8 | uVar39 >> 8;
                      local_260.base = (uint8_t *)((long)local_260.base + 2);
                      if (uVar40 < 0x40) {
                        if ((*(byte *)((long)local_248 + (ulong)(uVar40 >> 3)) >> (uVar40 & 7) & 1)
                            != 0) {
                          uVar28 = 0x2f;
                          goto LAB_0011512a;
                        }
                        pbVar1 = (byte *)((long)local_248 + (ulong)(uVar40 >> 3));
                        *pbVar1 = *pbVar1 | (byte)(1 << ((byte)(uVar39 >> 8) & 7));
                      }
                      uVar28 = 0x32;
                      iVar25 = 2;
                      if (1 < (ulong)((long)puVar43 - (long)local_260.base)) {
                        lVar31 = 0;
                        uVar46 = 0;
                        do {
                          uVar46 = (ulong)*(byte *)((long)local_260.base + lVar31) | uVar46 << 8;
                          lVar31 = lVar31 + 1;
                        } while (lVar31 != 2);
                        puVar45 = (ushort *)((long)puVar44 + 4);
                        local_260.base = (uint8_t *)puVar45;
                        if (uVar46 <= (ulong)((long)puVar43 - (long)puVar45)) {
                          psVar11 = tls->ctx->on_extension;
                          local_268 = (ushort *)CONCAT44(local_268._4_4_,(uint)uVar40);
                          if (psVar11 == (st_ptls_on_extension_t *)0x0) {
                            uVar28 = 0;
LAB_00114b99:
                            local_250 = (ushort *)((long)puVar45 + uVar46);
                            puVar42 = local_250;
                            if ((int)(uint)local_268 < 0x2c) {
                              if ((uint)local_268 == 0x29) {
                                uVar28 = 0x2f;
                                if (local_208._0_4_ == 0) {
                                  uVar28 = 0x32;
                                  if (1 < (long)uVar46) {
                                    local_292 = *(ushort *)((long)puVar44 + 4) << 8 |
                                                *(ushort *)((long)puVar44 + 4) >> 8;
                                    goto LAB_00114c53;
                                  }
                                  goto LAB_00114c5e;
                                }
                              }
                              else {
                                if ((uint)local_268 != 0x2b) goto LAB_00114c7f;
                                uVar28 = 0x32;
                                if (1 < (long)uVar46) {
                                  uVar24 = *(ushort *)((long)puVar44 + 4) << 8 |
                                           *(ushort *)((long)puVar44 + 4) >> 8;
LAB_00114c53:
                                  local_260.base = (uint8_t *)((long)puVar44 + 6);
                                  uVar28 = 0;
                                }
LAB_00114c5e:
                                if (1 < (long)uVar46) {
                                  uVar28 = 0;
                                  puVar42 = (ushort *)local_260.base;
                                  goto LAB_00114c7f;
                                }
                              }
LAB_00114d36:
                              iVar25 = 2;
                            }
                            else {
                              if ((uint)local_268 == 0x2c) {
                                if (local_208._0_4_ == 0) {
                                  uVar28 = 0x2f;
                                  goto LAB_00114d36;
                                }
                                local_268 = (ushort *)CONCAT44(local_268._4_4_,2);
                                uVar29 = 0x32;
                                if (uVar46 < 2) {
                                  bVar50 = false;
                                }
                                else {
                                  lVar31 = 0;
                                  uVar46 = 0;
                                  do {
                                    uVar46 = (ulong)*(byte *)((long)puVar45 + lVar31) | uVar46 << 8;
                                    lVar31 = lVar31 + 1;
                                  } while (lVar31 != 2);
                                  puVar45 = (ushort *)((long)puVar44 + 6);
                                  bVar50 = false;
                                  local_260.base = (uint8_t *)puVar45;
                                  if (uVar46 - 1 < (ulong)((long)local_250 - (long)puVar45)) {
                                    local_260.base = (uint8_t *)((long)puVar45 + uVar46);
                                    local_1f8[0].len = uVar46;
                                    local_1f8[0].base = (uint8_t *)puVar45;
                                    bVar50 = true;
                                    local_268 = (ushort *)((ulong)local_268._4_4_ << 0x20);
                                    uVar29 = uVar28;
                                  }
                                }
                                uVar28 = uVar29;
                                if (!bVar50) {
                                  iVar25 = (uint)local_268;
                                  goto LAB_00114d50;
                                }
                                puVar42 = (ushort *)local_260.base;
                                if ((ushort *)local_260.base != local_250) {
                                  uVar28 = 0x32;
                                  goto LAB_00114b78;
                                }
                              }
                              else if ((uint)local_268 == 0x33) {
                                if (local_208._0_4_ != 0) {
                                  uVar28 = 0x32;
                                  if (1 < (long)uVar46) {
                                    auStack_200._0_2_ =
                                         *(ushort *)((long)puVar44 + 4) << 8 |
                                         *(ushort *)((long)puVar44 + 4) >> 8;
                                    goto LAB_00114c53;
                                  }
                                  goto LAB_00114c5e;
                                }
                                uVar28 = decode_key_share_entry
                                                   ((uint16_t *)&local_23c,
                                                    (ptls_iovec_t *)auStack_200,&local_260.base,
                                                    (uint8_t *)local_250);
                                iVar25 = 2;
                                if (uVar28 == 0) {
                                  if ((ushort *)local_260.base != local_250) {
                                    uVar28 = 0x32;
                                    goto LAB_00114d10;
                                  }
                                  uVar28 = 0x2f;
                                  if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0)
                                  goto LAB_00114d10;
                                  bVar50 = false;
                                  if (tls->key_share->id == (uint16_t)local_23c) {
                                    bVar50 = true;
                                    iVar25 = 0;
                                    uVar28 = 0;
                                  }
                                }
                                else {
LAB_00114d10:
                                  bVar50 = false;
                                }
                                puVar42 = (ushort *)local_260.base;
                                if (!bVar50) goto LAB_00114d50;
                              }
LAB_00114c7f:
                              local_260.base = (uint8_t *)puVar42;
                              if ((ushort *)local_260.base != local_250) {
                                uVar28 = 0x32;
                              }
                              iVar25 = (uint)((ushort *)local_260.base != local_250) * 2;
                            }
                          }
                          else {
                            pVar57.len = uVar46;
                            pVar57.base = (uint8_t *)puVar45;
                            iVar25 = (*psVar11->cb)(psVar11,tls,'\x02',uVar40,pVar57);
                            uVar28 = (uint)(iVar25 != 0);
                            if (iVar25 == 0) goto LAB_00114b99;
LAB_00114b78:
                            iVar25 = 2;
                          }
                        }
                      }
LAB_00114d50:
                      if (iVar25 != 0) goto LAB_0011512a;
                    } while ((ushort *)local_260.base != puVar43);
                  }
                  bVar50 = true;
                }
              }
LAB_00115136:
              if ((bVar50) && (uVar28 = 0x32, (ushort *)local_260.base == puVar37)) {
                lVar31 = 0;
                do {
                  puVar37 = (ushort *)((long)supported_versions + lVar31);
                  if (*puVar37 == uVar24) break;
                  bVar50 = lVar31 != 6;
                  lVar31 = lVar31 + 2;
                } while (bVar50);
                puVar43 = (ushort *)local_260.base;
                if (*puVar37 != uVar24) goto LAB_00113fb4;
                if (local_208._0_4_ == 0) {
                  if (local_292 != 0xffff) {
                    if ((local_292 != 0) ||
                       (((tls->field_18).server.pending_traffic_secret[0x38] & 1) == 0))
                    goto LAB_00113fb4;
                    tls->field_0x160 = tls->field_0x160 | 2;
                  }
                  if ((auStack_200 == (undefined1  [8])0x0) &&
                     (uVar28 = 0x2f, (tls->field_0x160 & 2) == 0)) goto LAB_00113fba;
                }
                uVar28 = 0;
              }
            }
          }
        }
      }
    }
LAB_00113fba:
    if (uVar28 == 0) {
      sVar41 = (tls->field_18).client.legacy_session_id.len;
      uVar28 = 0x2f;
      if (local_218._8_8_ == sVar41) {
        iVar25 = (*ptls_mem_equal)((void *)local_218._0_8_,
                                   (tls->field_18).client.legacy_session_id.base,sVar41);
        if (iVar25 != 0) {
          if (local_208._0_4_ == 0) {
            uVar28 = 0;
            if (((tls->field_18).server.pending_traffic_secret[0x38] & 1) != 0) {
              uVar28 = (uint)((tls->field_0x160 & 2) == 0);
            }
            uVar28 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,uVar28);
            if (uVar28 == 0) {
              if (auStack_200 != (undefined1  [8])0x0) {
                pVar53.len = (size_t)local_1f8[0].base;
                pVar53.base = (uint8_t *)auStack_200;
                uVar28 = (*((tls->field_18).client.key_share_ctx)->on_exchange)
                                   (&(tls->field_18).client.key_share_ctx,1,
                                    (ptls_iovec_t *)local_288,pVar53);
                if (uVar28 != 0) goto LAB_00114134;
              }
              ppVar6 = tls->key_schedule;
              if (ppVar6->num_hashes != 0) {
                pppVar47 = &ppVar6->hashes[0].ctx;
                sVar41 = 0;
                do {
                  (*(*pppVar47)->update)(*pppVar47,emitter_00,(size_t)puVar33);
                  sVar41 = sVar41 + 1;
                  pppVar47 = pppVar47 + 2;
                } while (sVar41 != ppVar6->num_hashes);
              }
              uVar28 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)local_288._0_16_);
              if ((uVar28 == 0) &&
                 (uVar28 = setup_traffic_protection(tls,0,"s hs traffic",2,0), uVar28 == 0)) {
                if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0) {
                  uVar28 = setup_traffic_protection(tls,1,"c hs traffic",2,0);
LAB_00114530:
                  if (uVar28 == 0) {
LAB_00114538:
                    tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
                    uVar28 = 0x202;
                  }
                }
                else {
                  puVar33 = (uint8_t *)malloc(0x40);
                  tls->pending_handshake_secret = puVar33;
                  if (puVar33 == (uint8_t *)0x0) {
                    uVar28 = 0x201;
                  }
                  else {
                    uVar28 = derive_secret(tls->key_schedule,puVar33,"c hs traffic");
                    if (uVar28 == 0) {
                      psVar12 = tls->ctx->update_traffic_key;
                      if (psVar12 != (st_ptls_update_traffic_key_t *)0x0) {
                        uVar28 = (*psVar12->cb)(psVar12,tls,1,2,tls->pending_handshake_secret);
                        goto LAB_00114530;
                      }
                      goto LAB_00114538;
                    }
                  }
                }
              }
            }
          }
          else {
            uVar28 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,0);
            if (uVar28 == 0) {
              ppVar9 = (tls->field_18).client.key_share_ctx;
              if (ppVar9 != (ptls_key_exchange_context_t *)0x0) {
                pppVar2 = &(tls->field_18).client.key_share_ctx;
                (*ppVar9->on_exchange)(pppVar2,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
                *pppVar2 = (ptls_key_exchange_context_t *)0x0;
              }
              if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) != 0) {
                if (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0) {
                  __ptr = (tls->traffic_protection).enc.aead;
                  if (__ptr == (st_ptls_aead_context_t *)0x0) {
                    __assert_fail("tls->traffic_protection.enc.aead != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                                  ,0x8f3,
                                  "int handle_hello_retry_request(ptls_t *, ptls_message_emitter_t *, struct st_ptls_server_hello_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                 );
                  }
                  (*__ptr->dispose_crypto)(__ptr);
                  (*ptls_clear_memory)(__ptr->static_iv,__ptr->algo->iv_size);
                  free(__ptr);
                  (tls->traffic_protection).enc.aead = (ptls_aead_context_t *)0x0;
                }
                puVar44 = (tls->field_18).server.pending_traffic_secret + 0x38;
                *puVar44 = *puVar44 & 0xfd;
              }
              if (auStack_200._0_2_ == 0xffff) {
                if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
                  return 0x2f;
                }
              }
              else {
                pppVar30 = tls->ctx->key_exchanges;
                ppVar10 = *pppVar30;
                if (ppVar10 == (ptls_key_exchange_algorithm_t *)0x0) {
                  return 0x2f;
                }
                uVar4 = ppVar10->id;
                while (uVar4 != auStack_200._0_2_) {
                  pppVar30 = pppVar30 + 1;
                  ppVar10 = *pppVar30;
                  if (ppVar10 == (ptls_key_exchange_algorithm_t *)0x0) {
                    return 0x2f;
                  }
                  uVar4 = ppVar10->id;
                }
                tls->key_share = ppVar10;
              }
              key_schedule_transform_post_ch1hash(tls->key_schedule);
              ppVar6 = tls->key_schedule;
              if (ppVar6->num_hashes != 0) {
                pppVar47 = &ppVar6->hashes[0].ctx;
                sVar41 = 0;
                do {
                  (*(*pppVar47)->update)(*pppVar47,emitter_00,(size_t)puVar33);
                  sVar41 = sVar41 + 1;
                  pppVar47 = pppVar47 + 2;
                } while (sVar41 != ppVar6->num_hashes);
              }
              iVar25 = send_client_hello(tls,emitter,properties,local_1f8);
              return iVar25;
            }
          }
        }
      }
    }
LAB_00114134:
    if ((uint8_t *)local_288._0_8_ == (uint8_t *)0x0) {
      return uVar28;
    }
    (*ptls_clear_memory)((void *)local_288._0_8_,local_288._8_8_);
    src = (uint8_t *)local_288._0_8_;
    goto LAB_00114445;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    if (cVar3 != '\b') {
      return 10;
    }
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_288._8_8_;
    local_288._0_16_ = auVar16 << 0x40;
    auVar18 = local_288._0_16_;
    local_288._0_2_ = 0x2020;
    auVar16 = local_288._0_16_;
    puVar37 = (ushort *)((long)&emitter_00->buf + 4);
    local_288._7_9_ = auVar18._7_9_;
    local_288._0_6_ = auVar16._0_6_;
    uVar19 = local_288._0_6_;
    local_288._0_7_ = 0x8000000000000;
    local_238._0_2_ = 0xffff;
    local_288._0_6_ = uVar19 | 0x3a0000000000;
    uVar28 = 0x32;
    if (((ulong)puVar33 & 0xfffffffffffffffe) == 4) {
      bVar50 = false;
      bVar49 = false;
      pvVar36 = (void *)0x0;
      uVar28 = 0x32;
    }
    else {
      lVar31 = 0;
      puVar44 = (uint8_t *)0x0;
      do {
        puVar44 = (uint8_t *)((ulong)*(byte *)((long)puVar37 + lVar31) | (long)puVar44 << 8);
        lVar31 = lVar31 + 1;
      } while (lVar31 != 2);
      puVar37 = (ushort *)((long)&emitter_00->buf + 6);
      if (puVar33 + -6 < puVar44) {
        bVar50 = false;
      }
      else {
        bVar50 = puVar44 == (uint8_t *)0x0;
        if (!bVar50) {
          puVar45 = (ushort *)(puVar44 + (long)puVar37);
          local_250 = (ushort *)CONCAT44(local_250._4_4_,1);
          bVar50 = false;
          pvVar36 = (void *)0x0;
          puVar43 = puVar37;
          while (uVar28 = 0x32, puVar37 = puVar43, 1 < (long)puVar45 - (long)puVar43) {
            uVar24 = *puVar43;
            uVar39 = uVar24 << 8 | uVar24 >> 8;
            puVar42 = puVar43 + 1;
            uVar29 = (uint)uVar39;
            puVar37 = puVar42;
            if (uVar39 < 0x40) {
              if (((byte)local_288[uVar39 >> 3] >> (uVar29 & 7) & 1) != 0) {
                uVar28 = 0x2f;
                break;
              }
              local_288[uVar39 >> 3] =
                   local_288[uVar39 >> 3] | (byte)(1 << ((byte)(uVar24 >> 8) & 7));
            }
            uVar28 = 0x32;
            if ((ulong)((long)puVar45 - (long)puVar42) < 2) {
              bVar49 = false;
            }
            else {
              lVar31 = 0;
              uVar46 = 0;
              do {
                uVar46 = (ulong)*(byte *)((long)puVar42 + lVar31) | uVar46 << 8;
                lVar31 = lVar31 + 1;
              } while (lVar31 != 2);
              puVar37 = puVar43 + 2;
              uVar32 = 0;
              if ((ulong)((long)puVar45 - (long)puVar37) < uVar46) {
                bVar49 = false;
              }
              else {
                psVar11 = tls->ctx->on_extension;
                if (psVar11 == (st_ptls_on_extension_t *)0x0) {
LAB_00113bbc:
                  puVar42 = (ushort *)((long)puVar42 + uVar46 + 2);
                  if (uVar29 < 0x2a) {
                    if (uVar39 != 0) {
                      if (uVar29 != 0x10) {
LAB_00113c13:
                        local_268 = (ushort *)CONCAT44(local_268._4_4_,uVar32);
                        handle_unknown_extension
                                  (tls,properties,uVar39,(uint8_t *)puVar37,(uint8_t *)puVar42,
                                   (ptls_raw_extension_t *)local_238);
                        uVar28 = (uint)local_268;
                        goto LAB_00113cd4;
                      }
                      uVar28 = 0x32;
                      bVar49 = true;
                      if (1 < uVar46) {
                        lVar31 = 0;
                        uVar46 = 0;
                        do {
                          uVar46 = (ulong)*(byte *)((long)puVar37 + lVar31) | uVar46 << 8;
                          lVar31 = lVar31 + 1;
                        } while (lVar31 != 2);
                        puVar37 = puVar43 + 3;
                        if ((ulong)((long)puVar42 - (long)puVar37) < uVar46) {
                          bVar49 = true;
                        }
                        else {
                          local_268 = (ushort *)((long)puVar37 + uVar46);
                          uVar28 = 0x32;
                          bVar49 = true;
                          if (uVar46 == 0) {
                            bVar17 = false;
                          }
                          else {
                            uVar46 = (ulong)(byte)puVar43[3];
                            puVar37 = (ushort *)((long)puVar43 + 7);
                            if (((ulong)((long)local_268 - (long)puVar37) < uVar46) || (uVar46 == 0)
                               ) {
                              bVar17 = false;
                            }
                            else {
                              uVar29 = ptls_set_negotiated_protocol(tls,(char *)puVar37,uVar46);
                              uVar28 = 0;
                              if (uVar29 == 0) {
                                puVar37 = (ushort *)((long)puVar37 + uVar46);
                                bVar17 = true;
                                bVar49 = false;
                              }
                              else {
                                bVar17 = false;
                                bVar49 = true;
                                uVar28 = uVar29;
                              }
                            }
                          }
                          if ((bVar17) && (bVar49 = puVar37 != local_268, bVar49)) {
                            uVar28 = 0x28;
                          }
                        }
                      }
                      if (!bVar49) {
                        if (puVar37 == puVar42) goto LAB_00113cd4;
                        uVar28 = 0x32;
                      }
LAB_00113df7:
                      bVar49 = false;
                      goto LAB_00113dfc;
                    }
                    uVar29 = 0x32;
                    if (uVar46 == 0) {
                      uVar28 = 0x2f;
                      uVar29 = 0x2f;
                      if (tls->server_name != (char *)0x0) {
                        local_268 = (ushort *)CONCAT44(local_268._4_4_,uVar32);
                        iVar25 = ptls_server_name_is_ipaddr(tls->server_name);
                        if (iVar25 == 0) {
                          uVar28 = (uint)local_268;
                          goto LAB_00113cd4;
                        }
                        goto LAB_00113b87;
                      }
                    }
                  }
                  else {
                    uVar28 = uVar32;
                    if (uVar29 == 0x2a) {
                      if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) != 0) {
                        local_250 = (ushort *)((ulong)local_250 & 0xffffffff00000000);
LAB_00113cd4:
                        bVar49 = true;
                        puVar37 = puVar42;
                        goto LAB_00113dfc;
                      }
                      uVar29 = 0x2f;
                    }
                    else {
                      if (uVar29 != 0xffce) goto LAB_00113c13;
                      if ((char)*puVar37 == '\0') {
                        if (uVar46 != 0x11) {
                          uVar28 = 0x2f;
                          goto LAB_00113df7;
                        }
                        pvVar36 = (void *)((long)puVar43 + 5);
                        goto LAB_00113cd4;
                      }
                      uVar29 = 0x208;
                    }
                  }
                  uVar28 = uVar29;
                  bVar49 = false;
                }
                else {
                  pVar55.len = uVar46;
                  pVar55.base = (uint8_t *)puVar37;
                  local_268 = puVar37;
                  iVar25 = (*psVar11->cb)(psVar11,tls,'\b',uVar39,pVar55);
                  bVar49 = iVar25 != 0;
                  uVar32 = (uint)bVar49;
                  uVar28 = (uint)bVar49;
                  puVar37 = local_268;
                  if (iVar25 == 0) goto LAB_00113bbc;
LAB_00113b87:
                  bVar49 = false;
                }
              }
            }
LAB_00113dfc:
            if ((!bVar49) || (bVar50 = puVar37 == puVar45, puVar43 = puVar37, bVar50)) break;
          }
          bVar49 = (int)local_250 == 0;
          goto LAB_001145ae;
        }
      }
      bVar49 = false;
      pvVar36 = (void *)0x0;
    }
LAB_001145ae:
    if (!bVar50) {
      return uVar28;
    }
    if (puVar37 != (ushort *)((long)&emitter_00->buf + (long)puVar33)) {
      return 0x32;
    }
    if (tls->esni == (ptls_esni_secret_t *)0x0) {
      if (pvVar36 != (void *)0x0) {
        return 0x2f;
      }
    }
    else {
      if (pvVar36 == (void *)0x0) {
        return 0x2f;
      }
      iVar25 = (*ptls_mem_equal)(pvVar36,tls->esni->nonce,0x10);
      if (iVar25 == 0) {
        return 0x2f;
      }
      free_esni_secret(&tls->esni,0);
    }
    bVar23 = (tls->field_18).server.pending_traffic_secret[0x38];
    if ((bVar23 & 2) != 0) {
      if (bVar49 == false) {
        (tls->field_18).server.pending_traffic_secret[0x38] = bVar23 & 0xfd;
      }
      if (properties != (ptls_handshake_properties_t *)0x0) {
        (properties->field_0).client.early_data_acceptance = bVar49 + PTLS_EARLY_DATA_REJECTED;
      }
    }
    iVar25 = report_unknown_extensions(tls,properties,(ptls_raw_extension_t *)local_238);
    if (iVar25 == 0) {
      ppVar6 = tls->key_schedule;
      if (ppVar6->num_hashes != 0) {
        pppVar47 = &ppVar6->hashes[0].ctx;
        sVar41 = 0;
        do {
          (*(*pppVar47)->update)(*pppVar47,emitter_00,(size_t)puVar33);
          sVar41 = sVar41 + 1;
          pppVar47 = pppVar47 + 2;
        } while (sVar41 != ppVar6->num_hashes);
      }
      bVar23 = (tls->field_0x160 & 2) >> 1;
      tls->state = (uint)bVar23 + (uint)bVar23 * 2 +
                   PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE;
      return 0x202;
    }
    return iVar25;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    if (cVar3 != '\x19') {
      if (cVar3 != '\v') {
        return 10;
      }
      goto LAB_00113927;
    }
LAB_001138f5:
    psVar7 = tls->ctx->decompress_certificate;
    if (psVar7 == (st_ptls_decompress_certificate_t *)0x0) {
      uVar28 = 10;
    }
    else if ((long)puVar33 < 6) {
      uVar28 = 0x32;
    }
    else {
      uVar24 = *(ushort *)((long)&emitter_00->buf + 4);
      pbVar1 = (byte *)((long)&emitter_00->buf + 6);
      puVar44 = (uint8_t *)((long)&emitter_00->buf + (long)puVar33);
      if ((long)puVar44 - (long)pbVar1 < 3) {
        uVar28 = 0x32;
      }
      else {
        uVar29 = (uint)*(byte *)&emitter_00->enc |
                 (uint)*(byte *)((long)&emitter_00->buf + 7) << 8 | (uint)*pbVar1 << 0x10;
        puVar34 = (uint8_t *)((long)&emitter_00->enc + 1);
        if (uVar29 < 0x10001) {
          src = (uint8_t *)malloc((ulong)uVar29);
          if (src != (uint8_t *)0x0) {
            uVar28 = 0x32;
            if ((ulong)((long)puVar44 - (long)puVar34) < 3) {
              bVar50 = false;
            }
            else {
              lVar31 = 0;
              uVar46 = 0;
              do {
                uVar46 = (ulong)puVar34[lVar31] | uVar46 << 8;
                lVar31 = lVar31 + 1;
              } while (lVar31 != 3);
              puVar34 = (uint8_t *)((long)&emitter_00->enc + 4);
              if ((ulong)((long)puVar44 - (long)puVar34) < uVar46) {
                bVar50 = false;
              }
              else {
                local_238._8_8_ = uVar46;
                local_238._0_8_ = puVar34;
                pVar15.len = uVar46;
                pVar15.base = puVar34;
                pVar54.len._0_4_ = uVar29;
                pVar54.base = src;
                pVar54.len._4_4_ = 0;
                uVar28 = (*psVar7->cb)(psVar7,tls,uVar24 << 8 | uVar24 >> 8,pVar54,pVar15);
                bVar50 = uVar28 == 0;
                if (bVar50) {
                  puVar34 = puVar34 + uVar46;
                  uVar28 = 0;
                }
              }
            }
            if ((bVar50) && (uVar28 = 0x32, puVar34 == puVar44)) {
              uVar29 = handle_certificate(tls,src,src + uVar29,(int *)local_288);
              uVar28 = 0x2f;
              if (local_288._0_4_ != 0) {
                uVar28 = 0;
              }
              if (uVar29 != 0) {
                uVar28 = uVar29;
              }
              if (uVar28 == 0) {
                ppVar6 = tls->key_schedule;
                if (ppVar6->num_hashes != 0) {
                  pppVar47 = &ppVar6->hashes[0].ctx;
                  sVar41 = 0;
                  do {
                    (*(*pppVar47)->update)(*pppVar47,emitter_00,(size_t)puVar33);
                    sVar41 = sVar41 + 1;
                    pppVar47 = pppVar47 + 2;
                  } while (sVar41 != ppVar6->num_hashes);
                }
                tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
                uVar28 = 0x202;
              }
            }
            goto LAB_00114445;
          }
          uVar28 = 0x201;
        }
        else {
          uVar28 = 0x2a;
        }
      }
    }
    src = (uint8_t *)0x0;
LAB_00114445:
    free(src);
    return uVar28;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    if (cVar3 != '\x0f') {
      return 10;
    }
    iVar25 = handle_certificate_verify(tls,message,"TLS 1.3, server CertificateVerify");
    if (iVar25 == 0) {
      tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
      return 0x202;
    }
    return iVar25;
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    if (is_end_of_record == 0 || cVar3 != '\x14') {
      return 10;
    }
    iVar25 = verify_finished(tls,message);
    if (iVar25 == 0) {
      ppVar6 = tls->key_schedule;
      if (ppVar6->num_hashes != 0) {
        pppVar47 = &ppVar6->hashes[0].ctx;
        sVar41 = 0;
        do {
          (*(*pppVar47)->update)(*pppVar47,emitter_00,(size_t)puVar33);
          sVar41 = sVar41 + 1;
          pppVar47 = pppVar47 + 2;
        } while (sVar41 != ppVar6->num_hashes);
      }
      iVar25 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
      if ((((iVar25 == 0) &&
           (iVar25 = setup_traffic_protection(tls,0,"s ap traffic",3,0), iVar25 == 0)) &&
          (iVar25 = derive_secret(tls->key_schedule,local_238,"c ap traffic"), iVar25 == 0)) &&
         (iVar25 = derive_exporter_secret(tls,0), iVar25 == 0)) {
        if (tls->pending_handshake_secret != (uint8_t *)0x0) {
          if (((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) &&
             (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0)) {
            __assert_fail("tls->traffic_protection.enc.aead != NULL || tls->ctx->update_traffic_key != NULL"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                          ,0xb51,
                          "int client_handle_finished(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t)"
                         );
          }
          if ((((tls->field_18).server.pending_traffic_secret[0x38] & 2) != 0) &&
             ((tls->ctx->field_0x70 & 0x10) == 0)) {
            iVar25 = (*emitter->begin_message)(emitter);
            if (iVar25 == 0) {
              buf = emitter->buf;
              ppVar6 = tls->key_schedule;
              sVar41 = buf->off;
              iVar25 = ptls_buffer_reserve(buf,1);
              if (iVar25 == 0) {
                buf->base[buf->off] = '\x05';
                buf->off = buf->off + 1;
                iVar25 = 0;
              }
              bVar50 = true;
              if (iVar25 == 0) {
                iVar26 = ptls_buffer_reserve(buf,3);
                if (iVar26 == 0) {
                  puVar33 = buf->base;
                  sVar13 = buf->off;
                  puVar33[sVar13 + 2] = '\0';
                  puVar33 = puVar33 + sVar13;
                  puVar33[0] = '\0';
                  puVar33[1] = '\0';
                  buf->off = buf->off + 3;
                  iVar26 = 0;
                }
                bVar50 = true;
                iVar25 = iVar26;
                if (iVar26 == 0) {
                  sVar13 = buf->off;
                  lVar31 = -3;
                  do {
                    buf->base[lVar31 + sVar13] = '\0';
                    lVar31 = lVar31 + 1;
                  } while (lVar31 != 0);
                  bVar50 = false;
                  iVar25 = 0;
                }
                if (((iVar26 == 0) && (bVar50 = false, ppVar6 != (ptls_key_schedule_t *)0x0)) &&
                   (ppVar6->num_hashes != 0)) {
                  puVar33 = buf->base;
                  sVar13 = buf->off;
                  pppVar47 = &ppVar6->hashes[0].ctx;
                  bVar50 = false;
                  sVar35 = 0;
                  do {
                    (*(*pppVar47)->update)(*pppVar47,puVar33 + sVar41,sVar13 - sVar41);
                    sVar35 = sVar35 + 1;
                    pppVar47 = pppVar47 + 2;
                  } while (sVar35 != ppVar6->num_hashes);
                }
              }
              if (!bVar50) {
                iVar25 = (*emitter->commit_message)(emitter);
                bVar50 = iVar25 != 0;
              }
            }
            else {
              bVar50 = true;
            }
            if (bVar50) goto LAB_001138da;
            if (bVar50) {
              return iVar25;
            }
          }
          puVar33 = (tls->field_18).server.pending_traffic_secret + 0x38;
          *puVar33 = *puVar33 & 0xfd;
          iVar25 = commission_handshake_secret(tls);
          if (iVar25 != 0) goto LAB_001138da;
        }
        iVar25 = push_change_cipher_spec(tls,emitter);
        if (iVar25 == 0) {
          puVar33 = (tls->field_18).client.certificate_request.context.base;
          if (puVar33 != (uint8_t *)0x0) {
            iVar25 = 0x2f;
            if ((tls->field_0x160 & 2) != 0) goto LAB_001138da;
            context.len = (tls->field_18).client.certificate_request.context.len;
            context.base = puVar33;
            iVar25 = send_certificate_and_certificate_verify
                               (tls,emitter,
                                &(tls->field_18).client.certificate_request.signature_algorithms,
                                context,"TLS 1.3, client CertificateVerify",0,(uint16_t *)0x0,0);
            free((tls->field_18).client.certificate_request.context.base);
            *(uint8_t **)((long)&tls->field_18 + 0x40) = (uint8_t *)0x0;
            *(size_t *)((long)&tls->field_18 + 0x48) = 0;
            if (iVar25 != 0) goto LAB_001138da;
          }
          send_finished(tls,emitter);
          *(undefined8 *)(tls->traffic_protection).enc.secret = local_238._0_8_;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 8) = local_238._8_8_;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 0x10) = local_238._16_8_;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 0x18) = uStack_220;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 0x20) = local_218._0_8_;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 0x28) = local_218._8_8_;
          *(undefined1 (*) [8])((tls->traffic_protection).enc.secret + 0x30) = local_208;
          *(undefined1 (*) [8])((tls->traffic_protection).enc.secret + 0x38) = auStack_200;
          iVar25 = setup_traffic_protection(tls,1,(char *)0x0,3,0);
          if (iVar25 == 0) {
            tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
            iVar25 = 0;
          }
        }
      }
    }
LAB_001138da:
    (*ptls_clear_memory)(local_238,0x40);
    return iVar25;
  default:
    goto switchD_0011342c_caseD_8;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    if (cVar3 == '\x18') {
      message_00.base = puVar33;
      iVar25 = handle_key_update(tls,emitter_00,message_00);
      return iVar25;
    }
    if (cVar3 != '\x04') {
      return 10;
    }
    puVar44 = (uint8_t *)((long)&emitter_00->buf + 4);
    iVar25 = decode_new_session_ticket
                       (tls,(uint32_t *)local_288,local_248,&local_260,(ptls_iovec_t *)local_238,
                        &local_23c,puVar44,(uint8_t *)((long)&emitter_00->buf + (long)puVar33));
    if (iVar25 != 0) {
      return iVar25;
    }
    if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0) {
      return 0;
    }
    local_288._8_8_ = 0x200;
    local_288._0_8_ = (ptls_iovec_t *)local_238;
    stack0xfffffffffffffd88 = ZEXT812(0);
    psVar5 = tls->ctx->get_time;
    uVar27 = (*psVar5->cb)(psVar5);
    iVar25 = ptls_buffer_reserve((ptls_buffer_t *)local_288,8);
    if (iVar25 == 0) {
      *(uint64_t *)(local_288._0_8_ + local_288._16_8_) =
           uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 | (uVar27 & 0xff0000000000) >> 0x18
           | (uVar27 & 0xff00000000) >> 8 | (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18
           | (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
      local_288._16_8_ = local_288._16_8_ + 8;
      iVar25 = 0;
    }
    if (iVar25 == 0) {
      uVar24 = tls->key_share->id;
      iVar25 = ptls_buffer_reserve((ptls_buffer_t *)local_288,2);
      if (iVar25 == 0) {
        *(ushort *)(local_288._0_8_ + local_288._16_8_) = uVar24 << 8 | uVar24 >> 8;
        local_288._16_8_ = local_288._16_8_ + 2;
        iVar25 = 0;
      }
      if (iVar25 == 0) {
        uVar24 = tls->cipher_suite->id;
        iVar25 = ptls_buffer_reserve((ptls_buffer_t *)local_288,2);
        if (iVar25 == 0) {
          *(ushort *)(local_288._0_8_ + local_288._16_8_) = uVar24 << 8 | uVar24 >> 8;
          local_288._16_8_ = local_288._16_8_ + 2;
          iVar25 = 0;
        }
        if (iVar25 == 0) {
          iVar25 = ptls_buffer_reserve((ptls_buffer_t *)local_288,3);
          if (iVar25 == 0) {
            *(uint8_t *)(local_288._0_8_ + local_288._16_8_ + 2) = '\0';
            ((uint8_t *)(local_288._0_8_ + local_288._16_8_))[0] = '\0';
            ((uint8_t *)(local_288._0_8_ + local_288._16_8_))[1] = '\0';
            local_288._16_8_ = local_288._16_8_ + 3;
            iVar25 = 0;
          }
          iVar26 = 6;
          if (iVar25 == 0) {
            uVar20 = local_288._16_8_;
            iVar25 = ptls_buffer__do_pushv
                               ((ptls_buffer_t *)local_288,puVar44,(size_t)(puVar33 + -4));
            if (iVar25 == 0) {
              puVar33 = (uint8_t *)(local_288._0_8_ + (uVar20 - 3));
              lVar31 = 0x10;
              do {
                *puVar33 = (uint8_t)((ulong)(local_288._16_8_ - uVar20) >> ((byte)lVar31 & 0x3f));
                lVar31 = lVar31 + -8;
                puVar33 = puVar33 + 1;
              } while (lVar31 != -8);
              iVar26 = 0;
              iVar25 = 0;
            }
          }
          if (iVar26 != 6) {
            if (iVar26 != 0) {
              return 0;
            }
            iVar25 = ptls_buffer_reserve((ptls_buffer_t *)local_288,2);
            if (iVar25 == 0) {
              ((uint8_t *)(local_288._0_8_ + local_288._16_8_))[0] = '\0';
              ((uint8_t *)(local_288._0_8_ + local_288._16_8_))[1] = '\0';
              local_288._16_8_ = local_288._16_8_ + 2;
              iVar25 = 0;
            }
            iVar26 = 6;
            if (iVar25 == 0) {
              uVar20 = local_288._16_8_;
              iVar25 = ptls_buffer_reserve((ptls_buffer_t *)local_288,
                                           (tls->key_schedule->hashes[0].algo)->digest_size);
              if (iVar25 == 0) {
                uVar21 = local_288._0_8_;
                uVar22 = local_288._16_8_;
                nonce.len = local_260.len;
                nonce.base = local_260.base;
                iVar25 = derive_resumption_secret
                                   (tls->key_schedule,
                                    (uint8_t *)(local_288._0_8_ + local_288._16_8_),nonce);
                iVar26 = 6;
                if (iVar25 == 0) {
                  lVar48 = uVar22 + (tls->key_schedule->hashes[0].algo)->digest_size;
                  local_288._16_8_ = lVar48;
                  puVar33 = (uint8_t *)(uVar21 + (uVar20 - 2));
                  lVar31 = 8;
                  do {
                    *puVar33 = (uint8_t)((ulong)(lVar48 - uVar20) >> ((byte)lVar31 & 0x3f));
                    lVar31 = lVar31 + -8;
                    puVar33 = puVar33 + 1;
                  } while (lVar31 != -8);
                  iVar25 = 0;
                  iVar26 = 0;
                }
              }
            }
            if (iVar26 != 6) {
              if (iVar26 != 0) {
                return 0;
              }
              psVar14 = tls->ctx->save_ticket;
              pVar58.len = local_288._16_8_;
              pVar58.base = (uint8_t *)local_288._0_8_;
              iVar25 = (*psVar14->cb)(psVar14,tls,pVar58);
            }
          }
        }
      }
    }
    uVar20 = local_288._0_8_;
    (*ptls_clear_memory)((void *)local_288._0_8_,local_288._16_8_);
    if (iStack_270 != 0) {
      free((void *)uVar20);
      return iVar25;
    }
    return iVar25;
  }
  if (cVar3 == '\v') {
LAB_00113927:
    iVar26 = handle_certificate(tls,(uint8_t *)((long)&emitter_00->buf + 4),
                                (uint8_t *)((long)&emitter_00->buf + (long)puVar33),(int *)local_238
                               );
    iVar25 = 0x2f;
    if (local_238._0_4_ != 0) {
      iVar25 = 0;
    }
    if (iVar26 != 0) {
      iVar25 = iVar26;
    }
    if (iVar25 == 0) {
      ppVar6 = tls->key_schedule;
      if (ppVar6->num_hashes != 0) {
        pppVar47 = &ppVar6->hashes[0].ctx;
        sVar41 = 0;
        do {
          (*(*pppVar47)->update)(*pppVar47,emitter_00,(size_t)puVar33);
          sVar41 = sVar41 + 1;
          pppVar47 = pppVar47 + 2;
        } while (sVar41 != ppVar6->num_hashes);
      }
      tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
      return 0x202;
    }
    return iVar25;
  }
  if (cVar3 == '\x19') goto LAB_001138f5;
  if (cVar3 != '\r') {
    return 10;
  }
  uVar28 = 0x32;
  local_238._0_8_ = (ushort *)((long)&emitter_00->buf + 4);
  if (puVar33 == (uint8_t *)0x4) {
LAB_0011380d:
    bVar50 = false;
  }
  else {
    puVar37 = (ushort *)((long)&emitter_00->buf + 5);
    puVar44 = (uint8_t *)(ulong)*(byte *)((long)&emitter_00->buf + 4);
    local_238._0_8_ = puVar37;
    if (puVar33 + -5 < puVar44) goto LAB_0011380d;
    puVar43 = (ushort *)((long)puVar37 + (long)puVar44);
    puVar34 = (uint8_t *)0x1;
    if (puVar44 != (uint8_t *)0x0) {
      puVar34 = puVar44;
    }
    puVar34 = (uint8_t *)malloc((size_t)puVar34);
    (tls->field_18).client.certificate_request.context.base = puVar34;
    if (puVar34 == (uint8_t *)0x0) {
      uVar29 = 0x201;
    }
    else {
      (tls->field_18).client.certificate_request.context.len = (size_t)puVar44;
      memcpy(puVar34,puVar37,(size_t)puVar44);
      uVar29 = 0x32;
      local_238._0_8_ = puVar43;
    }
    uVar28 = 0x32;
    if ((ushort *)local_238._0_8_ == puVar43) {
      uVar28 = uVar29;
    }
    if (puVar34 == (uint8_t *)0x0) {
      uVar28 = uVar29;
    }
    bVar50 = puVar34 != (uint8_t *)0x0 && (ushort *)local_238._0_8_ == puVar43;
  }
  if (!bVar50) goto LAB_00114236;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_288._8_8_;
  local_288._0_16_ = auVar18 << 0x40;
  auVar18 = local_288._0_16_;
  local_288._0_3_ = 0x10401;
  auVar16 = local_288._0_16_;
  puVar37 = (ushort *)((long)&emitter_00->buf + (long)puVar33);
  local_288._7_9_ = auVar18._7_9_;
  local_288._0_6_ = auVar16._0_6_;
  uVar19 = local_288._0_6_;
  local_288._0_7_ = 0x8000000000000;
  local_288._0_6_ = uVar19 | 0x3e0000000000;
  if ((ulong)((long)puVar37 - local_238._0_8_) < 2) {
LAB_00114209:
    bVar50 = false;
    uVar28 = 0x32;
  }
  else {
    lVar31 = 0;
    uVar46 = 0;
    do {
      uVar46 = (ulong)*(byte *)(local_238._0_8_ + lVar31) | uVar46 << 8;
      lVar31 = lVar31 + 1;
    } while (lVar31 != 2);
    local_238._0_8_ = local_238._0_8_ + 2;
    if ((ulong)((long)puVar37 - local_238._0_8_) < uVar46) goto LAB_00114209;
    if (uVar46 == 0) {
      bVar50 = true;
    }
    else {
      puVar43 = (ushort *)(uVar46 + local_238._0_8_);
      uVar29 = 0;
      do {
        lVar31 = (long)puVar43 - local_238._0_8_;
        uVar28 = 0x32;
        if (1 < lVar31) {
          uVar29 = (uint)(ushort)(*(ushort *)local_238._0_8_ << 8 | *(ushort *)local_238._0_8_ >> 8)
          ;
          local_238._0_8_ = (ushort *)(local_238._0_8_ + 2);
          uVar28 = 0;
        }
        bVar50 = true;
        if (lVar31 < 2) goto LAB_00114999;
        uVar24 = (ushort)uVar29;
        if (uVar24 < 0x40) {
          if (((byte)local_288[uVar29 >> 3] >> (uVar29 & 7) & 1) != 0) {
            uVar28 = 0x2f;
            goto LAB_00114999;
          }
          local_288[uVar29 >> 3] = local_288[uVar29 >> 3] | (byte)(1 << ((byte)uVar29 & 7));
        }
        uVar28 = 0x32;
        if ((ulong)((long)puVar43 - local_238._0_8_) < 2) {
          bVar49 = false;
        }
        else {
          lVar31 = 0;
          uVar46 = 0;
          do {
            uVar46 = (ulong)*(byte *)(local_238._0_8_ + lVar31) | uVar46 << 8;
            lVar31 = lVar31 + 1;
          } while (lVar31 != 2);
          puVar45 = (ushort *)(local_238._0_8_ + 2);
          local_238._0_8_ = puVar45;
          bVar49 = false;
          if (uVar46 <= (ulong)((long)puVar43 - (long)puVar45)) {
            psVar11 = tls->ctx->on_extension;
            uVar28 = 0;
            if (psVar11 == (st_ptls_on_extension_t *)0x0) {
LAB_001143d2:
              uVar32 = uVar28;
              if (uVar24 == 0xd) {
                uVar28 = decode_signature_algorithms
                                   (&(tls->field_18).client.certificate_request.signature_algorithms
                                    ,(uint8_t **)local_238,(uint8_t *)((long)puVar45 + uVar46));
                uVar32 = 0;
                if (uVar28 != 0) goto LAB_001143fd;
              }
              uVar28 = uVar32;
              local_238._0_8_ = (ushort *)((long)puVar45 + uVar46);
              bVar50 = false;
              bVar49 = true;
            }
            else {
              pVar56.len = uVar46;
              pVar56.base = (uint8_t *)puVar45;
              iVar25 = (*psVar11->cb)(psVar11,tls,'\r',uVar24,pVar56);
              uVar28 = (uint)(iVar25 != 0);
              if (iVar25 == 0) goto LAB_001143d2;
LAB_001143fd:
              bVar49 = false;
            }
          }
        }
        if (!bVar49) goto LAB_00114999;
      } while ((ushort *)local_238._0_8_ != puVar43);
      bVar50 = false;
LAB_00114999:
      bVar50 = !bVar50;
    }
  }
  if (((bVar50) && (uVar28 = 0x32, (ushort *)local_238._0_8_ == puVar37)) &&
     (uVar28 = 0x6d, (tls->field_18).client.certificate_request.signature_algorithms.count != 0)) {
    uVar28 = 0;
  }
LAB_00114236:
  if (uVar28 != 0) {
    return uVar28;
  }
  if ((tls->field_18).client.certificate_request.context.len == 0) {
    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
    ppVar6 = tls->key_schedule;
    if (ppVar6->num_hashes != 0) {
      pppVar47 = &ppVar6->hashes[0].ctx;
      sVar41 = 0;
      do {
        (*(*pppVar47)->update)(*pppVar47,emitter_00,(size_t)puVar33);
        sVar41 = sVar41 + 1;
        pppVar47 = pppVar47 + 2;
      } while (sVar41 != ppVar6->num_hashes);
      return 0x202;
    }
    return 0x202;
  }
  return 0x2f;
}

Assistant:

static int handle_client_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                           ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_SERVER_HELLO && is_end_of_record) {
            ret = client_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
        if (type == PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS) {
            ret = client_handle_encrypted_extensions(tls, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST) {
            ret = client_handle_certificate_request(tls, message, properties);
            break;
        }
    /* fall through */
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_CERTIFICATE:
            ret = client_handle_certificate(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_COMPRESSED_CERTIFICATE:
            ret = client_handle_compressed_certificate(tls, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = client_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = client_handle_finished(tls, emitter, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET:
            ret = client_handle_new_session_ticket(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        ret = PTLS_ALERT_INTERNAL_ERROR;
        break;
    }

    PTLS_PROBE(RECEIVE_MESSAGE, tls, message.base[0], message.base + PTLS_HANDSHAKE_HEADER_SIZE,
               message.len - PTLS_HANDSHAKE_HEADER_SIZE, ret);

    return ret;
}